

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_column_mapper.cpp
# Opt level: O2

unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true> __thiscall
duckdb::MultiFileColumnMapper::CreateFilters
          (MultiFileColumnMapper *this,
          map<unsigned_long,_std::reference_wrapper<duckdb::TableFilter>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>_>_>
          *filters,ResultColumnMapping *mapping)

{
  _Base_ptr global_filter;
  LogicalType *args;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> _Var3;
  type pBVar4;
  iterator iVar5;
  reference pvVar6;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>>
  *p_Var7;
  reference pvVar8;
  type expr;
  __uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *__u;
  __uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *this_00;
  _Rb_tree_node_base *p_Var9;
  InternalException *this_01;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_std::allocator<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *in_RCX;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_98;
  _Head_base<0UL,_duckdb::TableFilterSet_*,_false> local_90;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_88;
  map<unsigned_long,_std::reference_wrapper<duckdb::TableFilter>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>_>_>
  *local_80;
  idx_t filter_idx;
  idx_t local_id;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_50;
  _Rb_tree_node_base *local_48;
  vector<duckdb::ColumnIndex,_true> *local_40;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_std::allocator<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_38;
  
  local_90._M_head_impl = (TableFilterSet *)this;
  if ((mapping->global_to_local)._M_h._M_rehash_policy._M_next_resize == 0) {
    this->context = (ClientContext *)0x0;
  }
  else {
    local_80 = filters;
    local_38 = in_RCX;
    pBVar4 = shared_ptr<duckdb::BaseFileReader,_true>::operator*
                       ((shared_ptr<duckdb::BaseFileReader,_true> *)
                        (filters->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent);
    make_uniq<duckdb::TableFilterSet>();
    local_48 = (_Rb_tree_node_base *)&(mapping->global_to_local)._M_h._M_bucket_count;
    local_40 = &pBVar4->column_indexes;
    local_50 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&pBVar4->expression_map;
    for (p_Var9 = (_Rb_tree_node_base *)(mapping->global_to_local)._M_h._M_element_count;
        p_Var9 != local_48; p_Var9 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var9)) {
      global_filter = p_Var9[1]._M_parent;
      iVar5 = ::std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_std::allocator<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(local_38,(key_type *)(p_Var9 + 1));
      if (iVar5.
          super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_false>
          ._M_cur == (__node_type *)0x0) {
        this_01 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_id,
                   "Error in \'EvaluateConstantFilters\', this filter should not end up in CreateFilters!"
                   ,(allocator *)&filter_idx);
        InternalException::InternalException(this_01,(string *)&local_id);
        __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_id = *(size_type *)
                  ((long)iVar5.
                         super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_false>
                         ._M_cur + 0x10);
      pvVar6 = vector<duckdb::ColumnIndex,_true>::get<true>(local_40,local_id);
      filter_idx = pvVar6->index;
      args = *(LogicalType **)
              ((long)iVar5.
                     super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_false>
                     ._M_cur + 0x58);
      local_88._M_head_impl = (TableFilter *)0x0;
      if (*(int *)((long)iVar5.
                         super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_false>
                         ._M_cur + 0x60) == 0) {
        (**(code **)(*(long *)global_filter + 0x20))(&local_98,global_filter);
LAB_008d233d:
        _Var3._M_head_impl = local_88._M_head_impl;
        local_88._M_head_impl = (TableFilter *)local_98._M_head_impl;
        local_98._M_head_impl = (Expression *)0x0;
        if ((Expression *)_Var3._M_head_impl != (Expression *)0x0) {
          (*((BaseExpression *)&(_Var3._M_head_impl)->_vptr_TableFilter)->_vptr_BaseExpression[1])()
          ;
          if (local_98._M_head_impl != (Expression *)0x0) {
            (*((local_98._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
        }
        if ((Expression *)local_88._M_head_impl == (Expression *)0x0) goto LAB_008d2393;
        p_Var7 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>>
                  *)unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                    ::operator->((unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                                  *)local_90._M_head_impl);
        ::std::
        _Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>>
        ::
        _M_emplace_unique<unsigned_long&,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
                  (p_Var7,&local_id,
                   (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                    *)&local_88);
      }
      else {
        if (*(int *)((long)iVar5.
                           super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_false>
                           ._M_cur + 0x60) == 1) {
          TryCastTableFilter((duckdb *)&local_98,(TableFilter *)global_filter,
                             (MultiFileIndexMapping *)
                             ((long)iVar5.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_false>
                                    ._M_cur + 0x10),
                             *(LogicalType **)
                              ((long)iVar5.
                                     super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_false>
                                     ._M_cur + 0x50));
          goto LAB_008d233d;
        }
LAB_008d2393:
        p_Var7 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>>
                  *)unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                    ::operator->((unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                                  *)local_90._M_head_impl);
        (**(code **)(*(long *)global_filter + 0x20))(&local_98,global_filter);
        ::std::
        _Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>>
        ::
        _M_emplace_unique<unsigned_long&,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
                  (p_Var7,&local_id,
                   (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                    *)&local_98);
        if (local_98._M_head_impl != (Expression *)0x0) {
          (*((local_98._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                              *)&(local_80->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent
                                 [2]._M_right,local_id);
        expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(pvVar8);
        SetIndexToZero(expr);
        __u = (__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
              vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::get<true>((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                           *)&(local_80->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent[2].
                              _M_right,local_id);
        this_00 = (__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                  ::std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[](local_50,&filter_idx);
        ::std::__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>::
        operator=(this_00,__u);
        make_uniq<duckdb::BoundReferenceExpression,duckdb::LogicalType_const&,unsigned_long&>
                  ((duckdb *)&local_98,args,&local_id);
        _Var2._M_head_impl = local_98._M_head_impl;
        local_98._M_head_impl = (Expression *)0x0;
        pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                              *)&(local_80->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent
                                 [2]._M_right,local_id);
        _Var1._M_head_impl =
             (pvVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var2._M_head_impl;
        if (_Var1._M_head_impl != (Expression *)0x0) {
          (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
        }
        if (local_98._M_head_impl != (Expression *)0x0) {
          (*((local_98._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
      }
      if ((Expression *)local_88._M_head_impl != (Expression *)0x0) {
        (*((BaseExpression *)&(local_88._M_head_impl)->_vptr_TableFilter)->_vptr_BaseExpression[1])
                  ();
      }
    }
  }
  return (unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>)
         (_Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>)
         local_90._M_head_impl;
}

Assistant:

unique_ptr<TableFilterSet> MultiFileColumnMapper::CreateFilters(map<idx_t, reference<TableFilter>> &filters,
                                                                ResultColumnMapping &mapping) {
	if (filters.empty()) {
		return nullptr;
	}
	auto &reader = *reader_data.reader;
	auto &global_to_local = mapping.global_to_local;
	auto result = make_uniq<TableFilterSet>();
	for (auto &it : filters) {
		auto &global_index = it.first;
		auto &global_filter = it.second.get();

		auto local_it = global_to_local.find(global_index);
		if (local_it == global_to_local.end()) {
			throw InternalException(
			    "Error in 'EvaluateConstantFilters', this filter should not end up in CreateFilters!");
		}
		auto &map_entry = local_it->second;
		auto local_id = map_entry.mapping.index;
		auto filter_idx = reader.column_indexes[local_id].GetPrimaryIndex();
		auto &local_type = map_entry.local_type;
		auto &global_type = map_entry.global_type;

		unique_ptr<TableFilter> local_filter;
		switch (map_entry.filter_conversion) {
		case FilterConversionType::COPY_DIRECTLY:
			// no conversion required - just copy the filter
			local_filter = global_filter.Copy();
			break;
		case FilterConversionType::CAST_FILTER:
			// types are different - try to convert
			local_filter = TryCastTableFilter(global_filter, map_entry.mapping, local_type);
			break;
		default:
			// we need to execute the filter globally
			break;
		}
		if (local_filter) {
			// succeeded in casting - push the local filter
			result->filters.emplace(local_id, std::move(local_filter));
		} else {
			// failed to cast - copy the global filter and evaluate the conversion expression in the reader
			result->filters.emplace(local_id, global_filter.Copy());

			// add the expression to the expression map - we are now evaluating this inside the reader directly
			// we need to set the index of the references inside the expression to 0
			SetIndexToZero(*reader_data.expressions[local_id]);
			reader.expression_map[filter_idx] = std::move(reader_data.expressions[local_id]);

			// reset the expression - since we are evaluating it in the reader we can just reference it
			reader_data.expressions[local_id] = make_uniq<BoundReferenceExpression>(global_type, local_id);
		}
	}
	return result;
}